

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O1

uint32_t FastPForLib::PFor2008::determineBestBase(DATATYPE *in,size_t size,uint32_t maxb)

{
  int *piVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  undefined1 (*pauVar8) [64];
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  value_type_conflict *__val;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM8 [16];
  
  auVar15 = in_ZMM1._0_16_;
  if (size == 0) {
    uVar6 = 0;
  }
  else {
    sVar13 = 0x10000;
    if (size < 0x10000) {
      sVar13 = size;
    }
    pauVar8 = (undefined1 (*) [64])operator_new(0x84);
    uVar6 = 0;
    *pauVar8 = ZEXT864(0) << 0x40;
    pauVar8[1] = ZEXT864(0) << 0x40;
    *(undefined4 *)pauVar8[2] = 0;
    if (0x10000 < size) {
      uVar6 = rand();
      uVar6 = uVar6 % (uint)((int)size - (int)sVar13);
    }
    uVar12 = (ulong)uVar6;
    uVar2 = sVar13 + uVar12;
    while (uVar12 < uVar2) {
      uVar6 = uVar6 + 1;
      uVar9 = in[uVar12];
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        iVar7 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        uVar9 = iVar7 + 1;
      }
      piVar1 = (int *)((long)*pauVar8 + (ulong)uVar9 * 4);
      *piVar1 = *piVar1 + 1;
      uVar12 = (ulong)uVar6;
    }
    uVar6 = maxb;
    if (maxb != 0) {
      auVar15 = vcvtusi2sd_avx512f(auVar15,maxb);
      iVar7 = 0;
      uVar10 = maxb;
      auVar14 = auVar15;
      do {
        uVar9 = uVar10 - 1;
        iVar7 = iVar7 + *(int *)((long)*pauVar8 + (ulong)uVar10 * 4);
        auVar17 = vcvtusi2sd_avx512f(in_XMM8,iVar7);
        auVar16._0_8_ = auVar17._0_8_ / (double)(long)sVar13;
        auVar16._8_8_ = auVar17._8_8_;
        if (iVar7 != 0) {
          auVar5 = vfmadd213sd_fma(ZEXT816(0x4060000000000000),auVar16,ZEXT816(0xbff0000000000000));
          auVar17 = vcvtusi2sd_avx512f(in_XMM8,1 << (uVar9 & 0x1f));
          auVar17._0_8_ = auVar5._0_8_ / (auVar16._0_8_ * auVar17._0_8_);
          auVar17._8_8_ = auVar5._8_8_;
          auVar16 = vmaxsd_avx(auVar17,auVar16);
        }
        auVar17 = vcvtusi2sd_avx512f(in_XMM8,uVar9);
        auVar16 = vfmadd231sd_fma(auVar17,auVar15,auVar16);
        if (auVar16._0_8_ <= auVar14._0_8_) {
          uVar6 = uVar9;
        }
        uVar3 = vcmpsd_avx512f(auVar16,auVar14,6);
        bVar4 = (bool)((byte)uVar3 & 1);
        auVar14._0_8_ = (ulong)bVar4 * (long)auVar14._0_8_ + (ulong)!bVar4 * (long)auVar16._0_8_;
        auVar14._8_8_ = auVar16._8_8_;
        uVar11 = uVar10 - 2;
        uVar10 = uVar9;
      } while (uVar11 < maxb);
    }
    operator_delete(pauVar8);
  }
  return uVar6;
}

Assistant:

static uint32_t determineBestBase(const DATATYPE *in, size_t size,
                                    const uint32_t maxb) {
    if (size == 0)
      return 0;
    const size_t defaultsamplesize = 64 * 1024;
    // the original paper describes sorting
    // a sample, but this only makes sense if you
    // are coding a frame of reference.
    size_t samplesize = size > defaultsamplesize ? defaultsamplesize : size;
    std::vector<uint32_t> freqs(33);
    // we choose the sample to be consecutive
    uint32_t rstart =
        size > samplesize
            ? (rand() % (static_cast<uint32_t>(size - samplesize)))
            : 0U;
    for (uint32_t k = rstart; k < rstart + samplesize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    uint32_t bestb = maxb;
    uint32_t numberofexceptions = 0;
    double Erate = 0;
    double bestcost = maxb;
    for (uint32_t b = bestb - 1; b < maxb; --b) {
      numberofexceptions += freqs[b + 1];
      Erate = static_cast<double>(numberofexceptions) /
              static_cast<double>(samplesize);
      /**
       * though this is not explicit in the original paper, you
       * need to somehow compensate for compulsory exceptions
       * when the chosen number of bits is small.
       *
       * We use their formula (3.1.5) to estimate actual number
       * of total exceptions, including compulsory exceptions.
       */
      if (numberofexceptions > 0) {
        double altErate = (Erate * 128 - 1) / (Erate * (1U << b));
        if (altErate > Erate)
          Erate = altErate;
      }
      const double thiscost = b + Erate * maxb;
      if (thiscost <= bestcost) {
        bestcost = thiscost;
        bestb = b;
      }
    }
    return bestb;
  }